

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void sha256_calc(uint8_t *hash,void *input,size_t len)

{
  undefined8 uVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint8_t *__s;
  uint uVar6;
  ulong __n;
  long lStack_200;
  uint local_1f8 [10];
  undefined8 local_1d0;
  int local_1c4;
  undefined8 local_1c0;
  uint8_t *local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  uint8_t *local_1a0;
  uint32_t h [8];
  uint8_t chunk [64];
  uint32_t w [64];
  
  h[4] = 0x510e527f;
  h[5] = 0x9b05688c;
  h[6] = 0x1f83d9ab;
  h[7] = 0x5be0cd19;
  h[0] = 0x6a09e667;
  h[1] = 0xbb67ae85;
  h[2] = 0x3c6ef372;
  h[3] = 0xa54ff53a;
  local_1c4 = (int)len * 8;
  local_1b0 = len >> 5;
  local_1c0 = 0;
  uVar1 = 0;
  local_1b8 = hash;
  while ((int)uVar1 == 0) {
    if (len < 0x40) {
      memcpy(chunk,input,len);
      __s = chunk + len;
      if ((int)local_1c0 == 0) {
        *__s = 0x80;
        __s = chunk + len + 1;
        local_1c0 = 1;
        lStack_200 = 0x3f;
      }
      else {
        lStack_200 = 0x40;
      }
      input = (void *)((long)input + len);
      __n = lStack_200 - len;
      if (__n < 8) {
        local_1d0 = 0;
        memset(__s,0,__n);
      }
      else {
        memset(__s,0,__n - 8);
        __s[__n - 1] = (uint8_t)local_1c4;
        uVar3 = local_1b0;
        for (uVar4 = 6; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
          __s[(ulong)uVar4 + (__n - 8)] = (uint8_t)uVar3;
          uVar3 = uVar3 >> 8;
        }
        local_1d0 = 1;
      }
      len = 0;
    }
    else {
      chunk._0_8_ = *input;
      chunk._8_8_ = *(undefined8 *)((long)input + 8);
      chunk._16_8_ = *(undefined8 *)((long)input + 0x10);
      chunk._24_8_ = *(undefined8 *)((long)input + 0x18);
      chunk._32_8_ = *(undefined8 *)((long)input + 0x20);
      chunk._40_8_ = *(undefined8 *)((long)input + 0x28);
      chunk._48_8_ = *(undefined8 *)((long)input + 0x30);
      chunk._56_8_ = *(undefined8 *)((long)input + 0x38);
      input = (void *)((long)input + 0x40);
      len = len - 0x40;
      local_1d0 = 0;
    }
    memset(w,0,0x100);
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      uVar4 = w[lVar2 + -0x10];
      w[lVar2] = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    }
    for (lVar2 = 0x10; lVar2 != 0x40; lVar2 = lVar2 + 1) {
      uVar4 = w[lVar2 + -0xf];
      uVar6 = w[lVar2 + -2];
      w[lVar2] = (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7)) +
                 w[lVar2 + -0x10] + w[lVar2 + -7] +
                 (uVar6 >> 10 ^ (uVar6 << 0xd | uVar6 >> 0x13) ^ (uVar6 << 0xf | uVar6 >> 0x11));
    }
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      local_1f8[lVar2] = h[lVar2];
    }
    for (lVar2 = 0; uVar6 = local_1f8[2], local_1f8[2] = local_1f8[1], local_1f8[1] = local_1f8[0],
        uVar4 = local_1f8[6], local_1f8[6] = local_1f8[5], local_1f8[5] = local_1f8[4],
        lVar2 != 0x100; lVar2 = lVar2 + 4) {
      iVar5 = (local_1f8[6] & local_1f8[5]) + local_1f8[7] + (~local_1f8[5] & uVar4) +
              ((local_1f8[5] << 7 | local_1f8[5] >> 0x19) ^
              (local_1f8[5] << 0x15 | local_1f8[5] >> 0xb) ^
              (local_1f8[5] << 0x1a | local_1f8[5] >> 6)) + *(int *)((long)k + lVar2) +
              *(int *)((long)w + lVar2);
      local_1f8[4] = local_1f8[3] + iVar5;
      local_1f8[7] = uVar4;
      local_1f8[0] = (uVar6 & local_1f8[2] ^ (uVar6 ^ local_1f8[2]) & local_1f8[1]) +
                     ((local_1f8[1] << 10 | local_1f8[1] >> 0x16) ^
                     (local_1f8[1] << 0x13 | local_1f8[1] >> 0xd) ^
                     (local_1f8[1] << 0x1e | local_1f8[1] >> 2)) + iVar5;
      local_1f8[3] = uVar6;
    }
    local_1f8[4] = local_1f8[5];
    local_1f8[5] = local_1f8[6];
    local_1f8[6] = uVar4;
    local_1f8[0] = local_1f8[1];
    local_1f8[1] = local_1f8[2];
    local_1f8[2] = uVar6;
    for (lVar2 = 0; uVar1 = local_1d0, local_1a8 = len, local_1a0 = (uint8_t *)input, lVar2 != 8;
        lVar2 = lVar2 + 1) {
      h[lVar2] = h[lVar2] + local_1f8[lVar2];
    }
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    uVar4 = h[lVar2];
    *(uint *)(local_1b8 + lVar2 * 4) =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  }
  return;
}

Assistant:

void sha256_calc(uint8_t hash[32], const void * input, size_t len)
{
   uint32_t h[] = { 0x6a09e667, 0xbb67ae85, 0x3c6ef372, 0xa54ff53a, 0x510e527f, 0x9b05688c, 0x1f83d9ab, 0x5be0cd19 };
   int i, j;

   uint8_t chunk[64];

   struct buffer_state state;

   init_buf_state(&state, input, len);

   while (calc_chunk(chunk, &state)) {
      uint32_t ah[8];

      uint32_t w[64];
      const uint8_t *p = chunk;

      memset(w, 0x00, sizeof w);
      for (i = 0; i < 16; i++) {
         w[i] = (uint32_t) p[0] << 24 | (uint32_t) p[1] << 16 |
            (uint32_t) p[2] << 8 | (uint32_t) p[3];
         p += 4;
      }

      for (i = 16; i < 64; i++) {
         const uint32_t s0 = right_rot(w[i - 15], 7) ^ right_rot(w[i - 15], 18) ^ (w[i - 15] >> 3);
         const uint32_t s1 = right_rot(w[i - 2], 17) ^ right_rot(w[i - 2], 19) ^ (w[i - 2] >> 10);
         w[i] = w[i - 16] + s0 + w[i - 7] + s1;
      }

      for (i = 0; i < 8; i++)
         ah[i] = h[i];

      for (i = 0; i < 64; i++) {
         const uint32_t s1 = right_rot(ah[4], 6) ^ right_rot(ah[4], 11) ^ right_rot(ah[4], 25);
         const uint32_t ch = (ah[4] & ah[5]) ^ (~ah[4] & ah[6]);
         const uint32_t temp1 = ah[7] + s1 + ch + k[i] + w[i];
         const uint32_t s0 = right_rot(ah[0], 2) ^ right_rot(ah[0], 13) ^ right_rot(ah[0], 22);
         const uint32_t maj = (ah[0] & ah[1]) ^ (ah[0] & ah[2]) ^ (ah[1] & ah[2]);
         const uint32_t temp2 = s0 + maj;

         ah[7] = ah[6];
         ah[6] = ah[5];
         ah[5] = ah[4];
         ah[4] = ah[3] + temp1;
         ah[3] = ah[2];
         ah[2] = ah[1];
         ah[1] = ah[0];
         ah[0] = temp1 + temp2;
      }

      for (i = 0; i < 8; i++)
         h[i] += ah[i];
   }

   for (i = 0, j = 0; i < 8; i++)
   {
      hash[j++] = (uint8_t) (h[i] >> 24);
      hash[j++] = (uint8_t) (h[i] >> 16);
      hash[j++] = (uint8_t) (h[i] >> 8);
      hash[j++] = (uint8_t) h[i];
   }
}